

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int xmlDictGrow(xmlDictPtr dict,uint size)

{
  ulong uVar1;
  xmlDictEntry *pxVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  xmlDictEntry *__s;
  xmlDictEntry *pxVar7;
  int iVar8;
  xmlDictEntry *pxVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  uVar11 = (ulong)size;
  __s = (xmlDictEntry *)(*xmlMalloc)(uVar11 * 0x10);
  if (__s == (xmlDictEntry *)0x0) {
    iVar12 = -1;
  }
  else {
    iVar12 = 0;
    memset(__s,0,uVar11 * 0x10);
    uVar1 = dict->size;
    iVar6 = (int)uVar1;
    if (iVar6 != 0) {
      pxVar2 = dict->table;
      uVar10 = pxVar2->hashValue;
      pxVar7 = pxVar2;
      while (uVar10 != 0) {
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + (uVar1 & 0xffffffff) <= pxVar7) {
          pxVar7 = pxVar2;
        }
        uVar10 = pxVar7->hashValue;
      }
      iVar8 = 0;
      do {
        if (pxVar7->hashValue != 0) {
          uVar10 = pxVar7->hashValue & size - 1;
          pxVar9 = __s + uVar10;
          uVar10 = __s[uVar10].hashValue;
          while (uVar10 != 0) {
            pxVar9 = pxVar9 + 1;
            if (__s + uVar11 <= pxVar9) {
              pxVar9 = __s;
            }
            uVar10 = pxVar9->hashValue;
          }
          uVar3 = *(undefined4 *)&pxVar7->field_0x4;
          uVar4 = *(undefined4 *)&pxVar7->name;
          uVar5 = *(undefined4 *)((long)&pxVar7->name + 4);
          pxVar9->hashValue = pxVar7->hashValue;
          *(undefined4 *)&pxVar9->field_0x4 = uVar3;
          *(undefined4 *)&pxVar9->name = uVar4;
          *(undefined4 *)((long)&pxVar9->name + 4) = uVar5;
        }
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + (uVar1 & 0xffffffff) <= pxVar7) {
          pxVar7 = dict->table;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar6 + (uint)(iVar6 == 0));
      (*xmlFree)(dict->table);
    }
    dict->table = __s;
    dict->size = uVar11;
  }
  return iVar12;
}

Assistant:

static int
xmlDictGrow(xmlDictPtr dict, unsigned size) {
    const xmlDictEntry *oldentry, *oldend, *end;
    xmlDictEntry *table;
    unsigned oldsize, i;

    /* Add 0 to avoid spurious -Wtype-limits warning on 64-bit GCC */
    if ((size_t) size + 0 > SIZE_MAX / sizeof(table[0]))
        return(-1);
    table = xmlMalloc(size * sizeof(table[0]));
    if (table == NULL)
        return(-1);
    memset(table, 0, size * sizeof(table[0]));

    oldsize = dict->size;
    if (oldsize == 0)
        goto done;

    oldend = &dict->table[oldsize];
    end = &table[size];

    /*
     * Robin Hood sorting order is maintained if we
     *
     * - compute dict indices with modulo
     * - resize by an integer factor
     * - start to copy from the beginning of a probe sequence
     */
    oldentry = dict->table;
    while (oldentry->hashValue != 0) {
        if (++oldentry >= oldend)
            oldentry = dict->table;
    }

    for (i = 0; i < oldsize; i++) {
        if (oldentry->hashValue != 0) {
            xmlDictEntry *entry = &table[oldentry->hashValue & (size - 1)];

            while (entry->hashValue != 0) {
                if (++entry >= end)
                    entry = table;
            }
            *entry = *oldentry;
        }

        if (++oldentry >= oldend)
            oldentry = dict->table;
    }

    xmlFree(dict->table);

done:
    dict->table = table;
    dict->size = size;

    return(0);
}